

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O3

void iadst16_w4_sse2(__m128i *input,__m128i *output)

{
  __m128i alVar1;
  __m128i alVar2;
  longlong lVar3;
  __m128i alVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  __m128i alVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar119 [16];
  __m128i alVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  __m128i alVar154;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar16 [16];
  undefined1 auVar29 [16];
  undefined1 auVar17 [16];
  undefined1 auVar30 [16];
  undefined1 auVar18 [16];
  undefined1 auVar31 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar42 [16];
  undefined1 auVar50 [16];
  undefined1 auVar43 [16];
  undefined1 auVar51 [16];
  undefined1 auVar44 [16];
  undefined1 auVar52 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar66 [16];
  undefined1 auVar71 [16];
  undefined1 auVar67 [16];
  undefined1 auVar72 [16];
  undefined1 auVar68 [16];
  undefined1 auVar73 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar90 [16];
  undefined1 auVar95 [16];
  undefined1 auVar91 [16];
  undefined1 auVar96 [16];
  undefined1 auVar92 [16];
  undefined1 auVar97 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  
  alVar120 = input[0xf];
  alVar111 = input[0xd];
  alVar154 = input[0xb];
  alVar1 = input[9];
  lVar3 = input[1][0];
  alVar4 = input[1];
  alVar2 = input[3];
  auVar103._0_12_ = alVar120._0_12_;
  auVar103._12_2_ = alVar120[0]._6_2_;
  auVar103._14_2_ = *(undefined2 *)((long)*input + 6);
  auVar102._12_4_ = auVar103._12_4_;
  auVar102._0_10_ = alVar120._0_10_;
  auVar102._10_2_ = *(undefined2 *)((long)*input + 4);
  auVar101._10_6_ = auVar102._10_6_;
  auVar101._0_8_ = alVar120[0];
  auVar101._8_2_ = alVar120[0]._4_2_;
  auVar100._8_8_ = auVar101._8_8_;
  auVar100._6_2_ = *(undefined2 *)((long)*input + 2);
  auVar100._4_2_ = alVar120[0]._2_2_;
  auVar100._0_2_ = (undefined2)alVar120[0];
  auVar100._2_2_ = (short)(*input)[0];
  auVar85._8_4_ = 0xc90ffb;
  auVar85._0_8_ = 0xc90ffb00c90ffb;
  auVar85._12_4_ = 0xc90ffb;
  auVar86 = pmaddwd(auVar85,auVar100);
  auVar33._8_4_ = 0xf00500c9;
  auVar33._0_8_ = 0xf00500c9f00500c9;
  auVar33._12_4_ = 0xf00500c9;
  auVar34 = pmaddwd(auVar33,auVar100);
  alVar120 = input[5];
  auVar20._0_12_ = alVar111._0_12_;
  auVar20._12_2_ = alVar111[0]._6_2_;
  auVar20._14_2_ = *(undefined2 *)((long)input[2] + 6);
  auVar88._12_4_ = auVar20._12_4_;
  auVar88._0_10_ = alVar111._0_10_;
  auVar88._10_2_ = *(undefined2 *)((long)input[2] + 4);
  auVar7._10_6_ = auVar88._10_6_;
  auVar7._0_8_ = alVar111[0];
  auVar7._8_2_ = alVar111[0]._4_2_;
  auVar22._8_8_ = auVar7._8_8_;
  auVar22._6_2_ = *(undefined2 *)((long)input[2] + 2);
  auVar22._4_2_ = alVar111[0]._2_2_;
  auVar22._0_2_ = (undefined2)alVar111[0];
  auVar22._2_2_ = (short)input[2][0];
  auVar104._8_4_ = 0x3e30f85;
  auVar104._0_8_ = 0x3e30f8503e30f85;
  auVar104._12_4_ = 0x3e30f85;
  auVar105 = pmaddwd(auVar104,auVar22);
  auVar54._8_4_ = 0xf07b03e3;
  auVar54._0_8_ = 0xf07b03e3f07b03e3;
  auVar54._12_4_ = 0xf07b03e3;
  auVar55 = pmaddwd(auVar54,auVar22);
  alVar111 = input[7];
  auVar18._0_12_ = alVar154._0_12_;
  auVar18._12_2_ = alVar154[0]._6_2_;
  auVar18._14_2_ = *(undefined2 *)((long)input[4] + 6);
  auVar17._12_4_ = auVar18._12_4_;
  auVar17._0_10_ = alVar154._0_10_;
  auVar17._10_2_ = *(undefined2 *)((long)input[4] + 4);
  auVar16._10_6_ = auVar17._10_6_;
  auVar16._0_8_ = alVar154[0];
  auVar16._8_2_ = alVar154[0]._4_2_;
  auVar15._8_8_ = auVar16._8_8_;
  auVar15._6_2_ = *(undefined2 *)((long)input[4] + 2);
  auVar15._4_2_ = alVar154[0]._2_2_;
  auVar15._0_2_ = (undefined2)alVar154[0];
  auVar15._2_2_ = (short)input[4][0];
  auVar121._8_4_ = 0x6d70e77;
  auVar121._0_8_ = 0x6d70e7706d70e77;
  auVar121._12_4_ = 0x6d70e77;
  auVar122 = pmaddwd(auVar121,auVar15);
  auVar106._8_4_ = 0xf18906d7;
  auVar106._0_8_ = 0xf18906d7f18906d7;
  auVar106._12_4_ = 0xf18906d7;
  auVar107 = pmaddwd(auVar106,auVar15);
  auVar5._0_12_ = alVar1._0_12_;
  auVar5._12_2_ = alVar1[0]._6_2_;
  auVar5._14_2_ = *(undefined2 *)((long)input[6] + 6);
  auVar150._12_4_ = auVar5._12_4_;
  auVar150._0_10_ = alVar1._0_10_;
  auVar150._10_2_ = *(undefined2 *)((long)input[6] + 4);
  auVar147._10_6_ = auVar150._10_6_;
  auVar147._0_8_ = alVar1[0];
  auVar147._8_2_ = alVar1[0]._4_2_;
  auVar134._8_8_ = auVar147._8_8_;
  auVar134._6_2_ = *(undefined2 *)((long)input[6] + 2);
  auVar134._4_2_ = alVar1[0]._2_2_;
  auVar134._0_2_ = (undefined2)alVar1[0];
  auVar134._2_2_ = (short)input[6][0];
  auVar19._8_4_ = 0x9880cda;
  auVar19._0_8_ = 0x9880cda09880cda;
  auVar19._12_4_ = 0x9880cda;
  auVar20 = pmaddwd(auVar19,auVar134);
  auVar112._8_4_ = 0xf3260988;
  auVar112._0_8_ = 0xf3260988f3260988;
  auVar112._12_4_ = 0xf3260988;
  auVar113 = pmaddwd(auVar112,auVar134);
  auVar46._0_12_ = alVar111._0_12_;
  auVar46._12_2_ = alVar111[0]._6_2_;
  auVar46._14_2_ = *(undefined2 *)((long)input[8] + 6);
  auVar78._12_4_ = auVar46._12_4_;
  auVar78._0_10_ = alVar111._0_10_;
  auVar78._10_2_ = *(undefined2 *)((long)input[8] + 4);
  auVar138._10_6_ = auVar78._10_6_;
  auVar138._0_8_ = alVar111[0];
  auVar138._8_2_ = alVar111[0]._4_2_;
  auVar140._8_8_ = auVar138._8_8_;
  auVar140._6_2_ = *(undefined2 *)((long)input[8] + 2);
  auVar140._4_2_ = alVar111[0]._2_2_;
  auVar140._0_2_ = (undefined2)alVar111[0];
  auVar140._2_2_ = (short)input[8][0];
  auVar137._8_4_ = 0xbdb0abf;
  auVar137._0_8_ = 0xbdb0abf0bdb0abf;
  auVar137._12_4_ = 0xbdb0abf;
  auVar138 = pmaddwd(auVar137,auVar140);
  auVar21._8_4_ = 0xf5410bdb;
  auVar21._0_8_ = 0xf5410bdbf5410bdb;
  auVar21._12_4_ = 0xf5410bdb;
  auVar22 = pmaddwd(auVar21,auVar140);
  auVar145._0_12_ = alVar120._0_12_;
  auVar145._12_2_ = alVar120[0]._6_2_;
  auVar145._14_2_ = *(undefined2 *)((long)input[10] + 6);
  auVar144._12_4_ = auVar145._12_4_;
  auVar144._0_10_ = alVar120._0_10_;
  auVar144._10_2_ = *(undefined2 *)((long)input[10] + 4);
  auVar143._10_6_ = auVar144._10_6_;
  auVar143._0_8_ = alVar120[0];
  auVar143._8_2_ = alVar120[0]._4_2_;
  auVar142._8_8_ = auVar143._8_8_;
  auVar142._6_2_ = *(undefined2 *)((long)input[10] + 2);
  auVar142._4_2_ = alVar120[0]._2_2_;
  auVar142._0_2_ = (undefined2)alVar120[0];
  auVar142._2_2_ = (short)input[10][0];
  auVar6._8_4_ = 0xdb9083a;
  auVar6._0_8_ = 0xdb9083a0db9083a;
  auVar6._12_4_ = 0xdb9083a;
  auVar7 = pmaddwd(auVar6,auVar142);
  auVar77._8_4_ = 0xf7c60db9;
  auVar77._0_8_ = 0xf7c60db9f7c60db9;
  auVar77._12_4_ = 0xf7c60db9;
  auVar78 = pmaddwd(auVar77,auVar142);
  auVar132._0_12_ = alVar2._0_12_;
  auVar132._12_2_ = alVar2[0]._6_2_;
  auVar132._14_2_ = *(undefined2 *)((long)input[0xc] + 6);
  auVar131._12_4_ = auVar132._12_4_;
  auVar131._0_10_ = alVar2._0_10_;
  auVar131._10_2_ = *(undefined2 *)((long)input[0xc] + 4);
  auVar130._10_6_ = auVar131._10_6_;
  auVar130._0_8_ = alVar2[0];
  auVar130._8_2_ = alVar2[0]._4_2_;
  auVar129._8_8_ = auVar130._8_8_;
  auVar129._6_2_ = *(undefined2 *)((long)input[0xc] + 2);
  auVar129._4_2_ = alVar2[0]._2_2_;
  auVar129._0_2_ = (undefined2)alVar2[0];
  auVar129._2_2_ = (short)input[0xc][0];
  auVar146._8_4_ = 0xf110564;
  auVar146._0_8_ = 0xf1105640f110564;
  auVar146._12_4_ = 0xf110564;
  auVar147 = pmaddwd(auVar146,auVar129);
  auVar149._8_4_ = 0xfa9c0f11;
  auVar149._0_8_ = 0xfa9c0f11fa9c0f11;
  auVar149._12_4_ = 0xfa9c0f11;
  auVar150 = pmaddwd(auVar149,auVar129);
  auVar44._0_12_ = alVar4._0_12_;
  auVar44._12_2_ = (short)((ulong)lVar3 >> 0x30);
  auVar44._14_2_ = *(undefined2 *)((long)input[0xe] + 6);
  auVar43._12_4_ = auVar44._12_4_;
  auVar43._0_10_ = alVar4._0_10_;
  auVar43._10_2_ = *(undefined2 *)((long)input[0xe] + 4);
  auVar42._10_6_ = auVar43._10_6_;
  auVar42._8_2_ = (short)((ulong)lVar3 >> 0x20);
  auVar42._0_8_ = lVar3;
  auVar41._8_8_ = auVar42._8_8_;
  auVar41._6_2_ = *(undefined2 *)((long)input[0xe] + 2);
  auVar41._4_2_ = (short)((ulong)lVar3 >> 0x10);
  auVar41._0_2_ = (undefined2)lVar3;
  auVar41._2_2_ = (short)input[0xe][0];
  auVar133._8_4_ = 0xfd40259;
  auVar133._0_8_ = 0xfd402590fd40259;
  auVar133._12_4_ = 0xfd40259;
  auVar134 = pmaddwd(auVar133,auVar41);
  auVar45._8_4_ = 0xfda70fd4;
  auVar45._0_8_ = 0xfda70fd4fda70fd4;
  auVar45._12_4_ = 0xfda70fd4;
  auVar46 = pmaddwd(auVar45,auVar41);
  auVar87._0_4_ = auVar86._0_4_ + 0x800 >> 0xc;
  auVar87._4_4_ = auVar86._4_4_ + 0x800 >> 0xc;
  auVar87._8_4_ = auVar86._8_4_ + 0x800 >> 0xc;
  auVar87._12_4_ = auVar86._12_4_ + 0x800 >> 0xc;
  auVar88 = packssdw(auVar87,auVar87);
  auVar139._0_4_ = auVar138._0_4_ + 0x800 >> 0xc;
  auVar139._4_4_ = auVar138._4_4_ + 0x800 >> 0xc;
  auVar139._8_4_ = auVar138._8_4_ + 0x800 >> 0xc;
  auVar139._12_4_ = auVar138._12_4_ + 0x800 >> 0xc;
  auVar140 = packssdw(auVar139,auVar139);
  auVar138 = paddsw(auVar88,auVar140);
  auVar140 = psubsw(auVar88,auVar140);
  auVar35._0_4_ = auVar34._0_4_ + 0x800 >> 0xc;
  auVar35._4_4_ = auVar34._4_4_ + 0x800 >> 0xc;
  auVar35._8_4_ = auVar34._8_4_ + 0x800 >> 0xc;
  auVar35._12_4_ = auVar34._12_4_ + 0x800 >> 0xc;
  auVar88 = packssdw(auVar35,auVar35);
  auVar23._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar23._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar23._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar23._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar22 = packssdw(auVar23,auVar23);
  auVar64 = paddsw(auVar88,auVar22);
  auVar22 = psubsw(auVar88,auVar22);
  auVar92._0_12_ = auVar140._0_12_;
  auVar92._12_2_ = auVar140._6_2_;
  auVar92._14_2_ = auVar22._6_2_;
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._0_10_ = auVar140._0_10_;
  auVar91._10_2_ = auVar22._4_2_;
  auVar90._10_6_ = auVar91._10_6_;
  auVar90._0_8_ = auVar140._0_8_;
  auVar90._8_2_ = auVar140._4_2_;
  auVar89._8_8_ = auVar90._8_8_;
  auVar89._6_2_ = auVar22._2_2_;
  auVar89._4_2_ = auVar140._2_2_;
  auVar89._0_2_ = auVar140._0_2_;
  auVar89._2_2_ = auVar22._0_2_;
  local_a8 = auVar105._0_4_;
  iStack_a4 = auVar105._4_4_;
  iStack_a0 = auVar105._8_4_;
  iStack_9c = auVar105._12_4_;
  auVar24._0_4_ = local_a8 + 0x800 >> 0xc;
  auVar24._4_4_ = iStack_a4 + 0x800 >> 0xc;
  auVar24._8_4_ = iStack_a0 + 0x800 >> 0xc;
  auVar24._12_4_ = iStack_9c + 0x800 >> 0xc;
  auVar22 = packssdw(auVar24,auVar24);
  auVar8._0_4_ = auVar7._0_4_ + 0x800 >> 0xc;
  auVar8._4_4_ = auVar7._4_4_ + 0x800 >> 0xc;
  auVar8._8_4_ = auVar7._8_4_ + 0x800 >> 0xc;
  auVar8._12_4_ = auVar7._12_4_ + 0x800 >> 0xc;
  auVar7 = packssdw(auVar8,auVar8);
  auVar140 = paddsw(auVar22,auVar7);
  auVar7 = psubsw(auVar22,auVar7);
  auVar56._0_4_ = auVar55._0_4_ + 0x800 >> 0xc;
  auVar56._4_4_ = auVar55._4_4_ + 0x800 >> 0xc;
  auVar56._8_4_ = auVar55._8_4_ + 0x800 >> 0xc;
  auVar56._12_4_ = auVar55._12_4_ + 0x800 >> 0xc;
  auVar88 = packssdw(auVar56,auVar56);
  auVar79._0_4_ = auVar78._0_4_ + 0x800 >> 0xc;
  auVar79._4_4_ = auVar78._4_4_ + 0x800 >> 0xc;
  auVar79._8_4_ = auVar78._8_4_ + 0x800 >> 0xc;
  auVar79._12_4_ = auVar78._12_4_ + 0x800 >> 0xc;
  auVar78 = packssdw(auVar79,auVar79);
  auVar22 = paddsw(auVar88,auVar78);
  auVar88 = psubsw(auVar88,auVar78);
  auVar123._0_4_ = auVar122._0_4_ + 0x800 >> 0xc;
  auVar123._4_4_ = auVar122._4_4_ + 0x800 >> 0xc;
  auVar123._8_4_ = auVar122._8_4_ + 0x800 >> 0xc;
  auVar123._12_4_ = auVar122._12_4_ + 0x800 >> 0xc;
  auVar108._0_4_ = auVar107._0_4_ + 0x800 >> 0xc;
  auVar108._4_4_ = auVar107._4_4_ + 0x800 >> 0xc;
  auVar108._8_4_ = auVar107._8_4_ + 0x800 >> 0xc;
  auVar108._12_4_ = auVar107._12_4_ + 0x800 >> 0xc;
  auVar34 = packssdw(auVar123,auVar123);
  auVar78 = packssdw(auVar108,auVar108);
  auVar148._0_4_ = auVar147._0_4_ + 0x800 >> 0xc;
  auVar148._4_4_ = auVar147._4_4_ + 0x800 >> 0xc;
  auVar148._8_4_ = auVar147._8_4_ + 0x800 >> 0xc;
  auVar148._12_4_ = auVar147._12_4_ + 0x800 >> 0xc;
  auVar151._0_4_ = auVar150._0_4_ + 0x800 >> 0xc;
  auVar151._4_4_ = auVar150._4_4_ + 0x800 >> 0xc;
  auVar151._8_4_ = auVar150._8_4_ + 0x800 >> 0xc;
  auVar151._12_4_ = auVar150._12_4_ + 0x800 >> 0xc;
  auVar55 = packssdw(auVar148,auVar148);
  auVar86 = packssdw(auVar151,auVar151);
  auVar68._0_12_ = auVar7._0_12_;
  auVar68._12_2_ = auVar7._6_2_;
  auVar68._14_2_ = auVar88._6_2_;
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._0_10_ = auVar7._0_10_;
  auVar67._10_2_ = auVar88._4_2_;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._0_8_ = auVar7._0_8_;
  auVar66._8_2_ = auVar7._4_2_;
  auVar65._8_8_ = auVar66._8_8_;
  auVar65._6_2_ = auVar88._2_2_;
  auVar65._4_2_ = auVar7._2_2_;
  auVar65._0_2_ = auVar7._0_2_;
  auVar65._2_2_ = auVar88._0_2_;
  auVar147 = paddsw(auVar34,auVar55);
  auVar55 = psubsw(auVar34,auVar55);
  auVar150 = paddsw(auVar78,auVar86);
  auVar88 = psubsw(auVar78,auVar86);
  local_78 = auVar20._0_4_;
  iStack_74 = auVar20._4_4_;
  iStack_70 = auVar20._8_4_;
  iStack_6c = auVar20._12_4_;
  auVar34._0_4_ = local_78 + 0x800 >> 0xc;
  auVar34._4_4_ = iStack_74 + 0x800 >> 0xc;
  auVar34._8_4_ = iStack_70 + 0x800 >> 0xc;
  auVar34._12_4_ = iStack_6c + 0x800 >> 0xc;
  auVar114._0_4_ = auVar113._0_4_ + 0x800 >> 0xc;
  auVar114._4_4_ = auVar113._4_4_ + 0x800 >> 0xc;
  auVar114._8_4_ = auVar113._8_4_ + 0x800 >> 0xc;
  auVar114._12_4_ = auVar113._12_4_ + 0x800 >> 0xc;
  auVar7 = packssdw(auVar34,auVar34);
  auVar78 = packssdw(auVar114,auVar114);
  auVar135._0_4_ = auVar134._0_4_ + 0x800 >> 0xc;
  auVar135._4_4_ = auVar134._4_4_ + 0x800 >> 0xc;
  auVar135._8_4_ = auVar134._8_4_ + 0x800 >> 0xc;
  auVar135._12_4_ = auVar134._12_4_ + 0x800 >> 0xc;
  auVar47._0_4_ = auVar46._0_4_ + 0x800 >> 0xc;
  auVar47._4_4_ = auVar46._4_4_ + 0x800 >> 0xc;
  auVar47._8_4_ = auVar46._8_4_ + 0x800 >> 0xc;
  auVar47._12_4_ = auVar46._12_4_ + 0x800 >> 0xc;
  auVar46 = packssdw(auVar135,auVar135);
  auVar20 = packssdw(auVar47,auVar47);
  auVar127._0_12_ = auVar55._0_12_;
  auVar127._12_2_ = auVar55._6_2_;
  auVar127._14_2_ = auVar88._6_2_;
  auVar126._12_4_ = auVar127._12_4_;
  auVar126._0_10_ = auVar55._0_10_;
  auVar126._10_2_ = auVar88._4_2_;
  auVar125._10_6_ = auVar126._10_6_;
  auVar125._0_8_ = auVar55._0_8_;
  auVar125._8_2_ = auVar55._4_2_;
  auVar124._8_8_ = auVar125._8_8_;
  auVar124._6_2_ = auVar88._2_2_;
  auVar124._4_2_ = auVar55._2_2_;
  auVar124._0_2_ = auVar55._0_2_;
  auVar124._2_2_ = auVar88._0_2_;
  auVar105 = paddsw(auVar7,auVar46);
  auVar7 = psubsw(auVar7,auVar46);
  auVar122 = paddsw(auVar78,auVar20);
  auVar20 = psubsw(auVar78,auVar20);
  auVar60._0_12_ = auVar7._0_12_;
  auVar60._12_2_ = auVar7._6_2_;
  auVar60._14_2_ = auVar20._6_2_;
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._0_10_ = auVar7._0_10_;
  auVar59._10_2_ = auVar20._4_2_;
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._0_8_ = auVar7._0_8_;
  auVar58._8_2_ = auVar7._4_2_;
  auVar57._8_8_ = auVar58._8_8_;
  auVar57._6_2_ = auVar20._2_2_;
  auVar57._4_2_ = auVar7._2_2_;
  auVar57._0_2_ = auVar7._0_2_;
  auVar57._2_2_ = auVar20._0_2_;
  auVar55._8_4_ = 0x31f0fb1;
  auVar55._0_8_ = 0x31f0fb1031f0fb1;
  auVar55._12_4_ = 0x31f0fb1;
  auVar109._8_4_ = 0xf04f031f;
  auVar109._0_8_ = 0xf04f031ff04f031f;
  auVar109._12_4_ = 0xf04f031f;
  auVar107 = pmaddwd(auVar109,auVar89);
  auVar34 = pmaddwd(auVar89,auVar55);
  auVar25._8_4_ = 0xfb1fce1;
  auVar25._0_8_ = 0xfb1fce10fb1fce1;
  auVar25._12_4_ = 0xfb1fce1;
  auVar88 = pmaddwd(auVar25,auVar124);
  auVar113 = pmaddwd(auVar124,auVar55);
  auVar9._8_4_ = 0xd4e08e4;
  auVar9._0_8_ = 0xd4e08e40d4e08e4;
  auVar9._12_4_ = 0xd4e08e4;
  auVar152._8_4_ = 0xf71c0d4e;
  auVar152._0_8_ = 0xf71c0d4ef71c0d4e;
  auVar152._12_4_ = 0xf71c0d4e;
  auVar134 = pmaddwd(auVar152,auVar65);
  auVar55 = pmaddwd(auVar65,auVar9);
  auVar86._8_4_ = 0x8e4f2b2;
  auVar86._0_8_ = 0x8e4f2b208e4f2b2;
  auVar86._12_4_ = 0x8e4f2b2;
  auVar7 = pmaddwd(auVar86,auVar57);
  auVar78 = pmaddwd(auVar57,auVar9);
  auVar20 = paddsw(auVar138,auVar147);
  auVar138 = psubsw(auVar138,auVar147);
  auVar147 = paddsw(auVar64,auVar150);
  auVar46 = psubsw(auVar64,auVar150);
  auVar118._0_12_ = auVar138._0_12_;
  auVar118._12_2_ = auVar138._6_2_;
  auVar118._14_2_ = auVar46._6_2_;
  auVar117._12_4_ = auVar118._12_4_;
  auVar117._0_10_ = auVar138._0_10_;
  auVar117._10_2_ = auVar46._4_2_;
  auVar116._10_6_ = auVar117._10_6_;
  auVar116._0_8_ = auVar138._0_8_;
  auVar116._8_2_ = auVar138._4_2_;
  auVar115._8_8_ = auVar116._8_8_;
  auVar115._6_2_ = auVar46._2_2_;
  auVar115._4_2_ = auVar138._2_2_;
  auVar115._0_2_ = auVar138._0_2_;
  auVar115._2_2_ = auVar46._0_2_;
  auVar46 = paddsw(auVar140,auVar105);
  auVar140 = psubsw(auVar140,auVar105);
  auVar86 = paddsw(auVar22,auVar122);
  auVar138 = psubsw(auVar22,auVar122);
  auVar69._0_4_ = auVar34._0_4_ + 0x800 >> 0xc;
  auVar69._4_4_ = auVar34._4_4_ + 0x800 >> 0xc;
  auVar69._8_4_ = auVar34._8_4_ + 0x800 >> 0xc;
  auVar69._12_4_ = auVar34._12_4_ + 0x800 >> 0xc;
  auVar110._0_4_ = auVar107._0_4_ + 0x800 >> 0xc;
  auVar110._4_4_ = auVar107._4_4_ + 0x800 >> 0xc;
  auVar110._8_4_ = auVar107._8_4_ + 0x800 >> 0xc;
  auVar110._12_4_ = auVar107._12_4_ + 0x800 >> 0xc;
  auVar34 = packssdw(auVar69,auVar69);
  auVar64 = packssdw(auVar110,auVar110);
  auVar26._0_4_ = auVar88._0_4_ + 0x800 >> 0xc;
  auVar26._4_4_ = auVar88._4_4_ + 0x800 >> 0xc;
  auVar26._8_4_ = auVar88._8_4_ + 0x800 >> 0xc;
  auVar26._12_4_ = auVar88._12_4_ + 0x800 >> 0xc;
  auVar128._0_4_ = auVar113._0_4_ + 0x800 >> 0xc;
  auVar128._4_4_ = auVar113._4_4_ + 0x800 >> 0xc;
  auVar128._8_4_ = auVar113._8_4_ + 0x800 >> 0xc;
  auVar128._12_4_ = auVar113._12_4_ + 0x800 >> 0xc;
  auVar22 = packssdw(auVar26,auVar26);
  auVar105 = packssdw(auVar128,auVar128);
  auVar39._0_12_ = auVar140._0_12_;
  auVar39._12_2_ = auVar140._6_2_;
  auVar39._14_2_ = auVar138._6_2_;
  auVar38._12_4_ = auVar39._12_4_;
  auVar38._0_10_ = auVar140._0_10_;
  auVar38._10_2_ = auVar138._4_2_;
  auVar37._10_6_ = auVar38._10_6_;
  auVar37._0_8_ = auVar140._0_8_;
  auVar37._8_2_ = auVar140._4_2_;
  auVar36._8_8_ = auVar37._8_8_;
  auVar36._6_2_ = auVar138._2_2_;
  auVar36._4_2_ = auVar140._2_2_;
  auVar36._0_2_ = auVar140._0_2_;
  auVar36._2_2_ = auVar138._0_2_;
  auVar113 = paddsw(auVar34,auVar22);
  auVar88 = psubsw(auVar34,auVar22);
  auVar150 = paddsw(auVar64,auVar105);
  auVar138 = psubsw(auVar64,auVar105);
  auVar93._0_4_ = auVar55._0_4_ + 0x800 >> 0xc;
  auVar93._4_4_ = auVar55._4_4_ + 0x800 >> 0xc;
  auVar93._8_4_ = auVar55._8_4_ + 0x800 >> 0xc;
  auVar93._12_4_ = auVar55._12_4_ + 0x800 >> 0xc;
  auVar153._0_4_ = auVar134._0_4_ + 0x800 >> 0xc;
  auVar153._4_4_ = auVar134._4_4_ + 0x800 >> 0xc;
  auVar153._8_4_ = auVar134._8_4_ + 0x800 >> 0xc;
  auVar153._12_4_ = auVar134._12_4_ + 0x800 >> 0xc;
  auVar140 = packssdw(auVar93,auVar93);
  auVar34 = packssdw(auVar153,auVar153);
  auVar64._0_4_ = auVar7._0_4_ + 0x800 >> 0xc;
  auVar64._4_4_ = auVar7._4_4_ + 0x800 >> 0xc;
  auVar64._8_4_ = auVar7._8_4_ + 0x800 >> 0xc;
  auVar64._12_4_ = auVar7._12_4_ + 0x800 >> 0xc;
  auVar61._0_4_ = auVar78._0_4_ + 0x800 >> 0xc;
  auVar61._4_4_ = auVar78._4_4_ + 0x800 >> 0xc;
  auVar61._8_4_ = auVar78._8_4_ + 0x800 >> 0xc;
  auVar61._12_4_ = auVar78._12_4_ + 0x800 >> 0xc;
  auVar7 = packssdw(auVar64,auVar64);
  auVar22 = packssdw(auVar61,auVar61);
  auVar73._0_12_ = auVar88._0_12_;
  auVar73._12_2_ = auVar88._6_2_;
  auVar73._14_2_ = auVar138._6_2_;
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._0_10_ = auVar88._0_10_;
  auVar72._10_2_ = auVar138._4_2_;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._0_8_ = auVar88._0_8_;
  auVar71._8_2_ = auVar88._4_2_;
  auVar70._8_8_ = auVar71._8_8_;
  auVar70._6_2_ = auVar138._2_2_;
  auVar70._4_2_ = auVar88._2_2_;
  auVar70._0_2_ = auVar88._0_2_;
  auVar70._2_2_ = auVar138._0_2_;
  auVar122 = paddsw(auVar140,auVar7);
  auVar7 = psubsw(auVar140,auVar7);
  auVar134 = paddsw(auVar34,auVar22);
  auVar22 = psubsw(auVar34,auVar22);
  auVar97._0_12_ = auVar7._0_12_;
  auVar97._12_2_ = auVar7._6_2_;
  auVar97._14_2_ = auVar22._6_2_;
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._0_10_ = auVar7._0_10_;
  auVar96._10_2_ = auVar22._4_2_;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._0_8_ = auVar7._0_8_;
  auVar95._8_2_ = auVar7._4_2_;
  auVar94._8_8_ = auVar95._8_8_;
  auVar94._6_2_ = auVar22._2_2_;
  auVar94._4_2_ = auVar7._2_2_;
  auVar94._0_2_ = auVar7._0_2_;
  auVar94._2_2_ = auVar22._0_2_;
  auVar105._8_4_ = 0xf138061f;
  auVar105._0_8_ = 0xf138061ff138061f;
  auVar105._12_4_ = 0xf138061f;
  auVar78 = pmaddwd(auVar115,auVar105);
  auVar55 = pmaddwd(auVar70,auVar105);
  auVar119._8_4_ = 0x61f0ec8;
  auVar119._0_8_ = 0x61f0ec8061f0ec8;
  auVar119._12_4_ = 0x61f0ec8;
  auVar88 = pmaddwd(auVar115,auVar119);
  auVar107._8_4_ = 0xec8f9e1;
  auVar107._0_8_ = 0xec8f9e10ec8f9e1;
  auVar107._12_4_ = 0xec8f9e1;
  auVar34 = pmaddwd(auVar36,auVar107);
  auVar140 = pmaddwd(auVar36,auVar119);
  auVar138 = pmaddwd(auVar70,auVar119);
  auVar7 = pmaddwd(auVar107,auVar94);
  auVar64 = pmaddwd(auVar94,auVar119);
  alVar154 = (__m128i)paddsw(auVar20,auVar46);
  auVar22 = psubsw(auVar20,auVar46);
  auVar105 = paddsw(auVar147,auVar86);
  auVar20 = psubsw(auVar147,auVar86);
  auVar13._0_12_ = auVar22._0_12_;
  auVar13._12_2_ = auVar22._6_2_;
  auVar13._14_2_ = auVar20._6_2_;
  auVar12._12_4_ = auVar13._12_4_;
  auVar12._0_10_ = auVar22._0_10_;
  auVar12._10_2_ = auVar20._4_2_;
  auVar11._10_6_ = auVar12._10_6_;
  auVar11._0_8_ = auVar22._0_8_;
  auVar11._8_2_ = auVar22._4_2_;
  auVar10._8_8_ = auVar11._8_8_;
  auVar10._6_2_ = auVar20._2_2_;
  auVar10._4_2_ = auVar22._2_2_;
  auVar10._0_2_ = auVar22._0_2_;
  auVar10._2_2_ = auVar20._0_2_;
  auVar27._0_4_ = auVar88._0_4_ + 0x800 >> 0xc;
  auVar27._4_4_ = auVar88._4_4_ + 0x800 >> 0xc;
  auVar27._8_4_ = auVar88._8_4_ + 0x800 >> 0xc;
  auVar27._12_4_ = auVar88._12_4_ + 0x800 >> 0xc;
  auVar22 = packssdw(auVar27,auVar27);
  auVar62._0_4_ = auVar34._0_4_ + 0x800 >> 0xc;
  auVar62._4_4_ = auVar34._4_4_ + 0x800 >> 0xc;
  auVar62._8_4_ = auVar34._8_4_ + 0x800 >> 0xc;
  auVar62._12_4_ = auVar34._12_4_ + 0x800 >> 0xc;
  auVar20 = packssdw(auVar62,auVar62);
  auVar107 = paddsw(auVar22,auVar20);
  auVar22 = psubsw(auVar22,auVar20);
  local_98._0_4_ = auVar78._0_4_;
  local_98._4_4_ = auVar78._4_4_;
  uStack_90._0_4_ = auVar78._8_4_;
  uStack_90._4_4_ = auVar78._12_4_;
  auVar63._0_4_ = (int)local_98 + 0x800 >> 0xc;
  auVar63._4_4_ = local_98._4_4_ + 0x800 >> 0xc;
  auVar63._8_4_ = (int)uStack_90 + 0x800 >> 0xc;
  auVar63._12_4_ = uStack_90._4_4_ + 0x800 >> 0xc;
  auVar88 = packssdw(auVar63,auVar63);
  auVar40._0_4_ = auVar140._0_4_ + 0x800 >> 0xc;
  auVar40._4_4_ = auVar140._4_4_ + 0x800 >> 0xc;
  auVar40._8_4_ = auVar140._8_4_ + 0x800 >> 0xc;
  auVar40._12_4_ = auVar140._12_4_ + 0x800 >> 0xc;
  auVar20 = packssdw(auVar40,auVar40);
  auVar86 = paddsw(auVar88,auVar20);
  auVar20 = psubsw(auVar88,auVar20);
  auVar31._0_12_ = auVar22._0_12_;
  auVar31._12_2_ = auVar22._6_2_;
  auVar31._14_2_ = auVar20._6_2_;
  auVar30._12_4_ = auVar31._12_4_;
  auVar30._0_10_ = auVar22._0_10_;
  auVar30._10_2_ = auVar20._4_2_;
  auVar29._10_6_ = auVar30._10_6_;
  auVar29._0_8_ = auVar22._0_8_;
  auVar29._8_2_ = auVar22._4_2_;
  auVar28._8_8_ = auVar29._8_8_;
  auVar28._6_2_ = auVar20._2_2_;
  auVar28._4_2_ = auVar22._2_2_;
  auVar28._0_2_ = auVar22._0_2_;
  auVar28._2_2_ = auVar20._0_2_;
  auVar46 = paddsw(auVar113,auVar122);
  auVar88 = psubsw(auVar113,auVar122);
  alVar111 = (__m128i)paddsw(auVar150,auVar134);
  auVar78 = psubsw(auVar150,auVar134);
  auVar48._0_4_ = auVar138._0_4_ + 0x800 >> 0xc;
  auVar48._4_4_ = auVar138._4_4_ + 0x800 >> 0xc;
  auVar48._8_4_ = auVar138._8_4_ + 0x800 >> 0xc;
  auVar48._12_4_ = auVar138._12_4_ + 0x800 >> 0xc;
  auVar74._0_4_ = auVar55._0_4_ + 0x800 >> 0xc;
  auVar74._4_4_ = auVar55._4_4_ + 0x800 >> 0xc;
  auVar74._8_4_ = auVar55._8_4_ + 0x800 >> 0xc;
  auVar74._12_4_ = auVar55._12_4_ + 0x800 >> 0xc;
  auVar22 = packssdw(auVar48,auVar48);
  auVar20 = packssdw(auVar74,auVar74);
  auVar113._0_4_ = auVar7._0_4_ + 0x800 >> 0xc;
  auVar113._4_4_ = auVar7._4_4_ + 0x800 >> 0xc;
  auVar113._8_4_ = auVar7._8_4_ + 0x800 >> 0xc;
  auVar113._12_4_ = auVar7._12_4_ + 0x800 >> 0xc;
  auVar98._0_4_ = auVar64._0_4_ + 0x800 >> 0xc;
  auVar98._4_4_ = auVar64._4_4_ + 0x800 >> 0xc;
  auVar98._8_4_ = auVar64._8_4_ + 0x800 >> 0xc;
  auVar98._12_4_ = auVar64._12_4_ + 0x800 >> 0xc;
  auVar7 = packssdw(auVar113,auVar113);
  auVar140 = packssdw(auVar98,auVar98);
  auVar83._0_12_ = auVar88._0_12_;
  auVar83._12_2_ = auVar88._6_2_;
  auVar83._14_2_ = auVar78._6_2_;
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._0_10_ = auVar88._0_10_;
  auVar82._10_2_ = auVar78._4_2_;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._0_8_ = auVar88._0_8_;
  auVar81._8_2_ = auVar88._4_2_;
  auVar80._8_8_ = auVar81._8_8_;
  auVar80._6_2_ = auVar78._2_2_;
  auVar80._4_2_ = auVar88._2_2_;
  auVar80._0_2_ = auVar88._0_2_;
  auVar80._2_2_ = auVar78._0_2_;
  alVar120 = (__m128i)paddsw(auVar22,auVar7);
  auVar7 = psubsw(auVar22,auVar7);
  auVar88 = paddsw(auVar20,auVar140);
  auVar22 = psubsw(auVar20,auVar140);
  auVar52._0_12_ = auVar7._0_12_;
  auVar52._12_2_ = auVar7._6_2_;
  auVar52._14_2_ = auVar22._6_2_;
  auVar51._12_4_ = auVar52._12_4_;
  auVar51._0_10_ = auVar7._0_10_;
  auVar51._10_2_ = auVar22._4_2_;
  auVar50._10_6_ = auVar51._10_6_;
  auVar50._0_8_ = auVar7._0_8_;
  auVar50._8_2_ = auVar7._4_2_;
  auVar49._8_8_ = auVar50._8_8_;
  auVar49._6_2_ = auVar22._2_2_;
  auVar49._4_2_ = auVar7._2_2_;
  auVar49._0_2_ = auVar7._0_2_;
  auVar49._2_2_ = auVar22._0_2_;
  auVar75._8_4_ = 0xb500b50;
  auVar75._0_8_ = 0xb500b500b500b50;
  auVar75._12_4_ = 0xb500b50;
  auVar7 = pmaddwd(auVar10,auVar75);
  auVar141._8_4_ = 0xf4b00b50;
  auVar141._0_8_ = 0xf4b00b50f4b00b50;
  auVar141._12_4_ = 0xf4b00b50;
  auVar22 = pmaddwd(auVar10,auVar141);
  auVar34 = pmaddwd(auVar28,auVar75);
  auVar20 = pmaddwd(auVar28,auVar141);
  auVar55 = pmaddwd(auVar80,auVar75);
  auVar78 = pmaddwd(auVar80,auVar141);
  auVar138 = pmaddwd(auVar75,auVar49);
  auVar140 = pmaddwd(auVar49,auVar141);
  *output = alVar154;
  alVar154 = (__m128i)psubsw((undefined1  [16])0x0,auVar46);
  output[1] = alVar154;
  output[2] = alVar120;
  alVar120 = (__m128i)psubsw((undefined1  [16])0x0,auVar107);
  output[3] = alVar120;
  auVar99._0_4_ = auVar34._0_4_ + 0x800 >> 0xc;
  auVar99._4_4_ = auVar34._4_4_ + 0x800 >> 0xc;
  auVar99._8_4_ = auVar34._8_4_ + 0x800 >> 0xc;
  auVar99._12_4_ = auVar34._12_4_ + 0x800 >> 0xc;
  alVar120 = (__m128i)packssdw(auVar99,auVar99);
  auVar76._0_4_ = auVar138._0_4_ + 0x800 >> 0xc;
  auVar76._4_4_ = auVar138._4_4_ + 0x800 >> 0xc;
  auVar76._8_4_ = auVar138._8_4_ + 0x800 >> 0xc;
  auVar76._12_4_ = auVar138._12_4_ + 0x800 >> 0xc;
  auVar46 = packssdw(auVar76,auVar76);
  output[4] = alVar120;
  alVar120 = (__m128i)psubsw((undefined1  [16])0x0,auVar46);
  output[5] = alVar120;
  auVar122._0_4_ = auVar7._0_4_ + 0x800 >> 0xc;
  auVar122._4_4_ = auVar7._4_4_ + 0x800 >> 0xc;
  auVar122._8_4_ = auVar7._8_4_ + 0x800 >> 0xc;
  auVar122._12_4_ = auVar7._12_4_ + 0x800 >> 0xc;
  auVar7 = packssdw(auVar122,auVar122);
  auVar136._0_4_ = auVar55._0_4_ + 0x800 >> 0xc;
  auVar136._4_4_ = auVar55._4_4_ + 0x800 >> 0xc;
  auVar136._8_4_ = auVar55._8_4_ + 0x800 >> 0xc;
  auVar136._12_4_ = auVar55._12_4_ + 0x800 >> 0xc;
  alVar120 = (__m128i)packssdw(auVar136,auVar136);
  output[6] = alVar120;
  alVar120 = (__m128i)psubsw((undefined1  [16])0x0,auVar7);
  output[7] = alVar120;
  auVar14._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar14._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar14._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar14._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  alVar120 = (__m128i)packssdw(auVar14,auVar14);
  auVar84._0_4_ = auVar78._0_4_ + 0x800 >> 0xc;
  auVar84._4_4_ = auVar78._4_4_ + 0x800 >> 0xc;
  auVar84._8_4_ = auVar78._8_4_ + 0x800 >> 0xc;
  auVar84._12_4_ = auVar78._12_4_ + 0x800 >> 0xc;
  auVar7 = packssdw(auVar84,auVar84);
  output[8] = alVar120;
  alVar120 = (__m128i)psubsw((undefined1  [16])0x0,auVar7);
  output[9] = alVar120;
  auVar32._0_4_ = auVar20._0_4_ + 0x800 >> 0xc;
  auVar32._4_4_ = auVar20._4_4_ + 0x800 >> 0xc;
  auVar32._8_4_ = auVar20._8_4_ + 0x800 >> 0xc;
  auVar32._12_4_ = auVar20._12_4_ + 0x800 >> 0xc;
  auVar7 = packssdw(auVar32,auVar32);
  auVar53._0_4_ = auVar140._0_4_ + 0x800 >> 0xc;
  auVar53._4_4_ = auVar140._4_4_ + 0x800 >> 0xc;
  auVar53._8_4_ = auVar140._8_4_ + 0x800 >> 0xc;
  auVar53._12_4_ = auVar140._12_4_ + 0x800 >> 0xc;
  alVar120 = (__m128i)packssdw(auVar53,auVar53);
  output[10] = alVar120;
  alVar120 = (__m128i)psubsw((undefined1  [16])0x0,auVar7);
  output[0xb] = alVar120;
  local_98 = auVar86._0_8_;
  uStack_90 = auVar86._8_8_;
  output[0xc][0] = local_98;
  output[0xc][1] = uStack_90;
  alVar120 = (__m128i)psubsw((undefined1  [16])0x0,auVar88);
  output[0xd] = alVar120;
  output[0xe] = alVar111;
  alVar120 = (__m128i)psubsw((undefined1  [16])0x0,auVar105);
  output[0xf] = alVar120;
  return;
}

Assistant:

static void iadst16_w4_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p02_p62 = pair_set_epi16(cospi[2], cospi[62]);
  const __m128i cospi_p62_m02 = pair_set_epi16(cospi[62], -cospi[2]);
  const __m128i cospi_p10_p54 = pair_set_epi16(cospi[10], cospi[54]);
  const __m128i cospi_p54_m10 = pair_set_epi16(cospi[54], -cospi[10]);
  const __m128i cospi_p18_p46 = pair_set_epi16(cospi[18], cospi[46]);
  const __m128i cospi_p46_m18 = pair_set_epi16(cospi[46], -cospi[18]);
  const __m128i cospi_p26_p38 = pair_set_epi16(cospi[26], cospi[38]);
  const __m128i cospi_p38_m26 = pair_set_epi16(cospi[38], -cospi[26]);
  const __m128i cospi_p34_p30 = pair_set_epi16(cospi[34], cospi[30]);
  const __m128i cospi_p30_m34 = pair_set_epi16(cospi[30], -cospi[34]);
  const __m128i cospi_p42_p22 = pair_set_epi16(cospi[42], cospi[22]);
  const __m128i cospi_p22_m42 = pair_set_epi16(cospi[22], -cospi[42]);
  const __m128i cospi_p50_p14 = pair_set_epi16(cospi[50], cospi[14]);
  const __m128i cospi_p14_m50 = pair_set_epi16(cospi[14], -cospi[50]);
  const __m128i cospi_p58_p06 = pair_set_epi16(cospi[58], cospi[6]);
  const __m128i cospi_p06_m58 = pair_set_epi16(cospi[6], -cospi[58]);
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_m56_p08 = pair_set_epi16(-cospi[56], cospi[8]);
  const __m128i cospi_m24_p40 = pair_set_epi16(-cospi[24], cospi[40]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_m48_p16 = pair_set_epi16(-cospi[48], cospi[16]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);

  // stage 1
  __m128i x[16];
  x[0] = input[15];
  x[1] = input[0];
  x[2] = input[13];
  x[3] = input[2];
  x[4] = input[11];
  x[5] = input[4];
  x[6] = input[9];
  x[7] = input[6];
  x[8] = input[7];
  x[9] = input[8];
  x[10] = input[5];
  x[11] = input[10];
  x[12] = input[3];
  x[13] = input[12];
  x[14] = input[1];
  x[15] = input[14];

  // stage 2
  btf_16_4p_sse2(cospi_p02_p62, cospi_p62_m02, x[0], x[1], x[0], x[1]);
  btf_16_4p_sse2(cospi_p10_p54, cospi_p54_m10, x[2], x[3], x[2], x[3]);
  btf_16_4p_sse2(cospi_p18_p46, cospi_p46_m18, x[4], x[5], x[4], x[5]);
  btf_16_4p_sse2(cospi_p26_p38, cospi_p38_m26, x[6], x[7], x[6], x[7]);
  btf_16_4p_sse2(cospi_p34_p30, cospi_p30_m34, x[8], x[9], x[8], x[9]);
  btf_16_4p_sse2(cospi_p42_p22, cospi_p22_m42, x[10], x[11], x[10], x[11]);
  btf_16_4p_sse2(cospi_p50_p14, cospi_p14_m50, x[12], x[13], x[12], x[13]);
  btf_16_4p_sse2(cospi_p58_p06, cospi_p06_m58, x[14], x[15], x[14], x[15]);

  // stage 3
  iadst16_stage3_ssse3(x);

  // stage 4
  btf_16_4p_sse2(cospi_p08_p56, cospi_p56_m08, x[8], x[9], x[8], x[9]);
  btf_16_4p_sse2(cospi_p40_p24, cospi_p24_m40, x[10], x[11], x[10], x[11]);
  btf_16_4p_sse2(cospi_m56_p08, cospi_p08_p56, x[12], x[13], x[12], x[13]);
  btf_16_4p_sse2(cospi_m24_p40, cospi_p40_p24, x[14], x[15], x[14], x[15]);

  // stage 5
  iadst16_stage5_ssse3(x);

  // stage 6
  btf_16_4p_sse2(cospi_p16_p48, cospi_p48_m16, x[4], x[5], x[4], x[5]);
  btf_16_4p_sse2(cospi_m48_p16, cospi_p16_p48, x[6], x[7], x[6], x[7]);
  btf_16_4p_sse2(cospi_p16_p48, cospi_p48_m16, x[12], x[13], x[12], x[13]);
  btf_16_4p_sse2(cospi_m48_p16, cospi_p16_p48, x[14], x[15], x[14], x[15]);

  // stage 7
  iadst16_stage7_ssse3(x);

  // stage 8
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[2], x[3], x[2], x[3]);
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[6], x[7], x[6], x[7]);
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[10], x[11], x[10], x[11]);
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[14], x[15], x[14], x[15]);

  // stage 9
  iadst16_stage9_ssse3(output, x);
}